

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gethostname.c
# Opt level: O2

int run_test_gethostname(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_70;
  size_t size;
  size_t enobufs_size;
  char buf [65];
  
  iVar1 = uv_os_gethostname(0);
  if (iVar1 == -0x16) {
    iVar1 = uv_os_gethostname(buf,0);
    if (iVar1 == -0x16) {
      iVar1 = uv_os_gethostname(buf);
      if (iVar1 == -0x16) {
        buf[0] = '\0';
        iVar1 = uv_os_gethostname();
        if (iVar1 == -0x69) {
          if (buf[0] == '\0') {
            pcVar2 = "enobufs_size > 1";
            uStack_70 = 0x30;
          }
          else {
            pcVar2 = "buf[0] == \'\\0\'";
            uStack_70 = 0x2f;
          }
        }
        else {
          pcVar2 = "r == UV_ENOBUFS";
          uStack_70 = 0x2e;
        }
      }
      else {
        pcVar2 = "r == UV_EINVAL";
        uStack_70 = 0x28;
      }
    }
    else {
      pcVar2 = "r == UV_EINVAL";
      uStack_70 = 0x25;
    }
  }
  else {
    pcVar2 = "r == UV_EINVAL";
    uStack_70 = 0x23;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-gethostname.c"
          ,uStack_70,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(gethostname) {
  char buf[UV_MAXHOSTNAMESIZE];
  size_t size;
  size_t enobufs_size;
  int r;

  /* Reject invalid inputs */
  size = 1;
  r = uv_os_gethostname(NULL, &size);
  ASSERT(r == UV_EINVAL);
  r = uv_os_gethostname(buf, NULL);
  ASSERT(r == UV_EINVAL);
  size = 0;
  r = uv_os_gethostname(buf, &size);
  ASSERT(r == UV_EINVAL);

  /* Return UV_ENOBUFS if the buffer cannot hold the hostname */
  enobufs_size = 1;
  buf[0] = '\0';
  r = uv_os_gethostname(buf, &enobufs_size);
  ASSERT(r == UV_ENOBUFS);
  ASSERT(buf[0] == '\0');
  ASSERT(enobufs_size > 1);

  /* Successfully get the hostname */
  size = UV_MAXHOSTNAMESIZE;
  r = uv_os_gethostname(buf, &size);
  ASSERT(r == 0);
  ASSERT(size > 1 && size == strlen(buf));
  ASSERT(size + 1 == enobufs_size);

  return 0;
}